

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

void __thiscall llvm::raw_fd_ostream::~raw_fd_ostream(raw_fd_ostream *this)

{
  error_code eVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  *(undefined ***)this = &PTR__raw_fd_ostream_0023fc10;
  if (-1 < this->FD) {
    if (*(long *)&this->field_0x18 != *(long *)&this->field_0x8) {
      raw_ostream::flush_nonempty((raw_ostream *)this);
    }
    if (this->ShouldClose == true) {
      eVar1 = sys::Process::SafelyCloseFileDescriptor(this->FD);
      if (eVar1._M_value != 0) {
        (this->EC)._M_value = eVar1._M_value;
        (this->EC)._M_cat = eVar1._M_cat;
      }
    }
  }
  if ((this->EC)._M_value == 0) {
    raw_ostream::~raw_ostream((raw_ostream *)this);
    return;
  }
  (**(code **)(*(long *)(this->EC)._M_cat + 0x20))(&local_50);
  std::operator+(&local_30,"IO failure on output stream: ",&local_50);
  report_fatal_error(&local_30,false);
}

Assistant:

raw_fd_ostream::~raw_fd_ostream() {
  if (FD >= 0) {
    flush();
    if (ShouldClose) {
      if (auto EC = sys::Process::SafelyCloseFileDescriptor(FD))
        error_detected(EC);
    }
  }

#ifdef __MINGW32__
  // On mingw, global dtors should not call exit().
  // report_fatal_error() invokes exit(). We know report_fatal_error()
  // might not write messages to stderr when any errors were detected
  // on FD == 2.
  if (FD == 2) return;
#endif

  // If there are any pending errors, report them now. Clients wishing
  // to avoid report_fatal_error calls should check for errors with
  // has_error() and clear the error flag with clear_error() before
  // destructing raw_ostream objects which may have errors.
  if (has_error())
    report_fatal_error("IO failure on output stream: " + error().message(),
                       /*GenCrashDiag=*/false);
}